

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

bool __thiscall metaf::TrendGroup::isProbabilityGroup(TrendGroup *this)

{
  bool bVar1;
  Type TVar2;
  Probability PVar3;
  TrendGroup *in_RDI;
  bool local_59;
  optional<metaf::MetafTime> local_4c;
  optional<metaf::MetafTime> local_38;
  optional<metaf::MetafTime> local_24;
  bool local_1;
  
  TVar2 = type(in_RDI);
  if (TVar2 == PROB) {
    PVar3 = probability(in_RDI);
    if (PVar3 == NONE) {
      local_1 = false;
    }
    else {
      timeFrom(&local_24,in_RDI);
      bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x240c36);
      local_59 = true;
      if (!bVar1) {
        timeUntil(&local_38,in_RDI);
        local_59 = std::optional<metaf::MetafTime>::has_value
                             ((optional<metaf::MetafTime> *)0x240c5c);
      }
      if (local_59 == false) {
        timeAt(&local_4c,in_RDI);
        bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x240c8a);
        if (bVar1) {
          local_1 = false;
        }
        else {
          local_1 = true;
        }
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TrendGroup::isProbabilityGroup() const {
	// Probability group has format PROB30 or PROB40
	// Probability must be reported and no time allowed
	if (type() != Type::PROB) return false;
	if (probability() == Probability::NONE) return false;
	if (timeFrom().has_value() || timeUntil().has_value()) return false;
	if (timeAt().has_value()) return false;
	return true;
}